

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::throwMessage(Forth *this,string *msg,errorCodes ec)

{
  Cell src;
  Cell CVar1;
  undefined1 local_40 [4];
  int ecInt;
  string buffer;
  errorCodes ec_local;
  string *msg_local;
  Forth *this_local;
  
  buffer.field_2._12_4_ = ec;
  initClass(this);
  std::__cxx11::string::string((string *)local_40);
  src = getSourceAddress(this);
  CVar1 = getSourceBufferSize(this);
  moveFromDataSpace(this,(string *)local_40,src,(ulong)CVar1);
  ForthStack<unsigned_int>::push(&this->dStack,buffer.field_2._12_4_);
  exceptionsThrow(this);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void throwMessage(const std::string &msg, enum errorCodes ec){
			initClass();
			std::string buffer{};
			int ecInt=static_cast<int>(ec);
			moveFromDataSpace(buffer, getSourceAddress(), getSourceBufferSize());
			dStack.push(ec);
			exceptionsThrow();
			//throw AbortException(msg + "\nError code " + std::to_string(ecInt) +"\n" + buffer + "\n Offset " + std::to_string(getSourceBufferOffset()));
		}